

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O0

void lace_resume(void)

{
  int next_1;
  uint i;
  int next;
  int state;
  
  do {
  } while (lace_awaken_count < 0);
  if (lace_awaken_count == 0) {
    LOCK();
    lace_awaken_count = -1;
    UNLOCK();
    for (next_1 = 0; (uint)next_1 < n_workers; next_1 = next_1 + 1) {
      sem_post((sem_t *)&suspend_semaphore);
    }
    lace_awaken_count = 1;
  }
  else {
    lace_awaken_count = lace_awaken_count + 1;
    LOCK();
    UNLOCK();
  }
  return;
}

Assistant:

void
lace_resume()
{
    while (1) {
        int state = atomic_load_explicit(&lace_awaken_count, memory_order_consume);
        if (state < 0) {
            continue; // wait until suspending is done
        } else if (state == 0) {
            int next = -1; // intermediate state
            if (atomic_compare_exchange_weak(&lace_awaken_count, &state, next) == 1) {
                for (unsigned int i=0; i<n_workers; i++) sem_post(&suspend_semaphore);
                atomic_store_explicit(&lace_awaken_count, 1, memory_order_release);
                break;
            }
        } else {
            int next = state + 1;
            if (atomic_compare_exchange_weak(&lace_awaken_count, &state, next) == 1) break;
        }
    }
}